

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_sub_array.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  initializer_list<int> __l;
  allocator_type local_51;
  vector<int,_std::allocator<int>_> test;
  int local_38 [12];
  
  local_38[4] = 2;
  local_38[5] = -1;
  local_38[6] = 2;
  local_38[7] = -4;
  local_38[0] = 2;
  local_38[1] = 4;
  local_38[2] = -7;
  local_38[3] = 5;
  local_38[8] = 3;
  __l._M_len = 9;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector(&test,__l,&local_51);
  iVar1 = find_max_subarray(&test);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&test.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	std::vector<int> test = {2, 4, -7, 5, 2, -1, 2, -4, 3};

	cout << find_max_subarray(test) << endl;
	return 0;
}